

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_doomedmap.cpp
# Opt level: O1

void Cmd_dumpmapthings(FCommandLine *argv,APlayerPawn *who,int key)

{
  Pair *pPVar1;
  PClassActor *pPVar2;
  bool bVar3;
  Node *pNVar4;
  NameEntry *pNVar5;
  long lVar6;
  IPair *pIVar7;
  ulong uVar8;
  ulong uVar9;
  Pair *unaff_R14;
  uint uVar10;
  TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
  infos;
  TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
  local_38;
  
  local_38.Most =
       TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CountUsed(&DoomEdMap)
  ;
  local_38.Count = 0;
  local_38.Array =
       (Pair **)M_Malloc_Dbg((long)(int)local_38.Most << 3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                             ,0x8c);
  uVar9 = 0;
  do {
    uVar10 = (uint)uVar9;
    if (uVar10 < DoomEdMap.Size) {
      pNVar4 = DoomEdMap.Nodes + uVar9;
      do {
        pIVar7 = &pNVar4->Pair;
        uVar10 = uVar10 + 1;
        uVar9 = (ulong)uVar10;
        if (*(long *)((long)(pIVar7 + -1) + 0x20) != 1) {
          bVar3 = true;
          unaff_R14 = (Pair *)pIVar7;
          goto LAB_00385efd;
        }
        pNVar4 = (Node *)(pIVar7 + 1);
      } while (uVar10 != DoomEdMap.Size);
      bVar3 = false;
      uVar9 = (ulong)DoomEdMap.Size;
    }
    else {
      bVar3 = false;
    }
LAB_00385efd:
    if (!bVar3) break;
    TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
    ::Grow(&local_38,1);
    local_38.Array[local_38.Count] = unaff_R14;
    local_38.Count = local_38.Count + 1;
  } while( true );
  if ((ulong)local_38.Count == 0) {
    Printf("No map things registered\n");
  }
  else {
    qsort(local_38.Array,(ulong)local_38.Count,8,sortnums);
    if (local_38.Count != 0) {
      uVar9 = 0;
      do {
        pPVar1 = local_38.Array[uVar9];
        pPVar2 = (pPVar1->Value).Type;
        if (pPVar2 == (PClassActor *)0x0) {
          lVar6 = (long)(pPVar1->Value).Special;
          uVar8 = (ulong)(uint)pPVar1->Key;
          if (0 < lVar6) {
            pNVar5 = (NameEntry *)(&DAT_0071c518 + lVar6 * 8);
            goto LAB_00385fa8;
          }
          Printf("%6d none\n",uVar8);
        }
        else {
          uVar8 = (ulong)(uint)pPVar1->Key;
          pNVar5 = FName::NameData.NameArray +
                   (pPVar2->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                   TypeName.Index;
LAB_00385fa8:
          Printf("%6d %s\n",uVar8,pNVar5->Text);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < local_38.Count);
    }
  }
  TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
  ::~TArray(&local_38);
  return;
}

Assistant:

CCMD (dumpmapthings)
{
	TArray<FDoomEdMap::Pair*> infos(DoomEdMap.CountUsed());
	FDoomEdMap::Iterator it(DoomEdMap);
	FDoomEdMap::Pair *pair;

	while (it.NextPair(pair))
	{
		infos.Push(pair);
	}

	if (infos.Size () == 0)
	{
		Printf ("No map things registered\n");
	}
	else
	{
		qsort (&infos[0], infos.Size (), sizeof(FDoomEdMap::Pair*), sortnums);

		for (unsigned i = 0; i < infos.Size (); ++i)
		{
			if (infos[i]->Value.Type != NULL)
			{
				Printf("%6d %s\n", infos[i]->Key, infos[i]->Value.Type->TypeName.GetChars());
			}
			else if (infos[i]->Value.Special > 0)
			{
				Printf("%6d %s\n", infos[i]->Key, SpecialMapthingNames[infos[i]->Value.Special - 1]);
			}
			else
			{
				Printf("%6d none\n", infos[i]->Key);
			}

		}
	}
}